

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonString.h
# Opt level: O3

Data * __thiscall Json::JsonString::data(Data *__return_storage_ptr__,JsonString *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->data1)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->data1).field_2;
  pcVar1 = (this->__str)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->__str)._M_string_length);
  __return_storage_ptr__->data2 = 0.0;
  __return_storage_ptr__->data3 = false;
  return __return_storage_ptr__;
}

Assistant:

Data data() const override { return Data{__str}; }